

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

int SimpleString::MemCmp(void *s1,void *s2,size_t n)

{
  byte *local_38;
  uchar *p2;
  uchar *p1;
  size_t n_local;
  void *s2_local;
  void *s1_local;
  
  local_38 = (byte *)s2;
  p2 = (uchar *)s1;
  p1 = (uchar *)n;
  while( true ) {
    if (p1 == (uchar *)0x0) {
      return 0;
    }
    if (*p2 != *local_38) break;
    p2 = p2 + 1;
    local_38 = local_38 + 1;
    p1 = p1 + -1;
  }
  return (uint)*p2 - (uint)*local_38;
}

Assistant:

int SimpleString::MemCmp(const void* s1, const void *s2, size_t n)
{
    const unsigned char* p1 = (const unsigned char*) s1;
    const unsigned char* p2 = (const unsigned char*) s2;

    while (n--)
        if (*p1 != *p2) {
            return *p1 - *p2;
        } else {
            ++p1;
            ++p2;
        }
    return 0;
}